

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_dns_name.c
# Opt level: O2

ares_status_t
ares_dns_name_write(ares_buf_t *buf,ares_llist_t **list,ares_bool_t validate_hostname,char *name)

{
  ares_status_t aVar1;
  ares_array_t *paVar2;
  ares_buf_t *buf_00;
  ares_status_t aVar3;
  ares_status_t aVar4;
  uint uVar5;
  uint uVar6;
  ares_bool_t aVar7;
  ulong uVar8;
  size_t sVar9;
  ares_buf_t *paVar10;
  uchar *data;
  undefined8 *puVar11;
  ares_buf_t *paVar12;
  ares_llist_t *paVar13;
  undefined8 *puVar14;
  char *pcVar15;
  ares_llist_node_t *paVar16;
  ares_llist_t **ppaVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  bool bVar21;
  byte local_291;
  ulong local_290;
  ares_array_t *local_288;
  size_t len;
  undefined4 local_274;
  ares_llist_t **local_270;
  ares_buf_t *local_268;
  ulong local_260;
  ares_buf_t *local_258;
  char *local_250;
  undefined8 *local_248;
  undefined8 local_240;
  char name_copy [512];
  
  local_240 = ares_buf_len(buf);
  if (name == (char *)0x0 || buf == (ares_buf_t *)0x0) {
    return ARES_EFORMERR;
  }
  local_288 = ares_array_create(8,ares_dns_labels_free_cb);
  if (local_288 == (ares_array_t *)0x0) {
    return ARES_ENOMEM;
  }
  uVar8 = ares_strcpy(name_copy,name,0x200);
  local_274 = (undefined4)CONCAT71((int7)(uVar8 >> 8),1);
  local_270 = list;
  local_260 = uVar8;
  local_258 = buf;
  local_250 = name;
  if (list == (ares_llist_t **)0x0) {
LAB_0011ec3d:
    puVar14 = (undefined8 *)0x0;
  }
  else {
    paVar13 = *list;
    sVar9 = ares_strlen(name_copy);
    if (sVar9 == 0 || paVar13 == (ares_llist_t *)0x0) goto LAB_0011ec3d;
    local_290 = CONCAT44(local_290._4_4_,validate_hostname);
    paVar16 = ares_llist_node_first(paVar13);
    puVar14 = (undefined8 *)0x0;
    for (; paVar16 != (ares_llist_node_t *)0x0; paVar16 = ares_llist_node_next(paVar16)) {
      puVar11 = (undefined8 *)ares_llist_node_val(paVar16);
      uVar8 = puVar11[1];
      if (((uVar8 <= sVar9) &&
          (((puVar14 == (undefined8 *)0x0 || ((ulong)puVar14[1] <= uVar8)) &&
           (aVar7 = ares_streq((char *)*puVar11,name_copy + (sVar9 - uVar8)), aVar7 != ARES_FALSE)))
          ) && ((sVar9 == uVar8 || (name_copy[(sVar9 - uVar8) + -1] == '.')))) {
        puVar14 = puVar11;
      }
    }
    validate_hostname = (ares_bool_t)local_290;
    if (puVar14 != (undefined8 *)0x0) {
      if (puVar14[1] == local_260) {
        local_290 = local_260;
        uVar8 = local_290;
      }
      else {
        uVar8 = ~puVar14[1] + local_260;
        name_copy[uVar8] = '\0';
        if (puVar14[1] != local_260) {
          local_274 = 0;
          goto LAB_0011ec43;
        }
      }
LAB_0011efbe:
      local_290 = uVar8;
      ppaVar17 = local_270;
      bVar21 = local_270 == (ares_llist_t **)0x0;
      aVar3 = ares_buf_append_be16(local_258,*(ushort *)(puVar14 + 2) | 0xc000);
      if (((aVar3 != ARES_SUCCESS || bVar21) || (aVar3 = ARES_SUCCESS, local_290 == 0)) ||
         (puVar14[1] == local_260)) goto LAB_0011f1a8;
LAB_0011f0c3:
      pcVar15 = local_250;
      sVar9 = ares_strlen(local_250);
      aVar3 = ARES_EFORMERR;
      if ((sVar9 == 0) || (sVar9 = ares_strlen(pcVar15), 0xff < sVar9)) goto LAB_0011f1a8;
      if (*ppaVar17 == (ares_llist_t *)0x0) {
        paVar13 = ares_llist_create(ares_nameoffset_free);
        *ppaVar17 = paVar13;
        if (paVar13 != (ares_llist_t *)0x0) goto LAB_0011f10e;
        puVar14 = (undefined8 *)0x0;
LAB_0011f19d:
        ares_nameoffset_free(puVar14);
      }
      else {
LAB_0011f10e:
        puVar14 = (undefined8 *)ares_malloc_zero(0x18);
        if (puVar14 != (undefined8 *)0x0) {
          pcVar15 = ares_strdup(local_250);
          *puVar14 = pcVar15;
          sVar9 = ares_strlen(pcVar15);
          puVar14[1] = sVar9;
          puVar14[2] = local_240;
          paVar16 = ares_llist_insert_last(*ppaVar17,puVar14);
          aVar3 = ARES_SUCCESS;
          if (paVar16 != (ares_llist_node_t *)0x0) goto LAB_0011f1a8;
          goto LAB_0011f19d;
        }
      }
      aVar3 = ARES_ENOMEM;
      goto LAB_0011f1a8;
    }
    puVar14 = (undefined8 *)0x0;
    uVar8 = local_260;
  }
LAB_0011ec43:
  local_248 = puVar14;
  paVar10 = ares_buf_create();
  buf_00 = local_258;
  if (paVar10 == (ares_buf_t *)0x0) {
    aVar3 = ARES_ENOMEM;
  }
  else {
    local_290 = CONCAT44(local_290._4_4_,validate_hostname);
    if (name_copy[0] != '\0') {
      sVar9 = ares_strlen(name_copy);
      aVar3 = ares_buf_append(paVar10,(uchar *)name_copy,sVar9);
      if (aVar3 != ARES_SUCCESS) goto LAB_0011ee46;
    }
    local_268 = ares_dns_labels_add(local_288);
    if (local_268 != (ares_buf_t *)0x0) {
      aVar1 = ARES_EBADNAME;
      do {
        while( true ) {
          aVar4 = ares_buf_fetch_bytes(paVar10,&local_291,1);
          paVar2 = local_288;
          aVar3 = aVar1;
          if (aVar4 != ARES_SUCCESS) {
            local_290 = uVar8;
            paVar12 = ares_dns_labels_get_last(local_288);
            sVar9 = ares_buf_len(paVar12);
            if (sVar9 == 0) {
              ares_array_remove_last(paVar2);
            }
            sVar9 = ares_array_len(paVar2);
            if (sVar9 == 1) {
              paVar12 = ares_dns_labels_get_last(paVar2);
              sVar9 = ares_buf_len(paVar12);
              if (sVar9 == 0) {
                ares_array_remove_last(paVar2);
              }
            }
            paVar2 = local_288;
            uVar19 = 0;
            lVar18 = 0;
            goto LAB_0011f07a;
          }
          if (local_291 != 0x5c) break;
          aVar4 = ares_buf_fetch_bytes(paVar10,(uchar *)&len,1);
          if (aVar4 != ARES_SUCCESS) goto LAB_0011ee46;
          uVar5 = (uint)(byte)len;
          if ((byte)((byte)len - 0x30) < 10) {
            lVar18 = 2;
            uVar6 = uVar5;
            while( true ) {
              uVar20 = uVar6 - 0x30;
              bVar21 = lVar18 == 0;
              lVar18 = lVar18 + -1;
              if (bVar21) break;
              aVar4 = ares_buf_fetch_bytes(paVar10,(uchar *)&len,1);
              if (aVar4 != ARES_SUCCESS) goto LAB_0011ee46;
              if (9 < (byte)((byte)len - 0x30)) goto LAB_0011ee46;
              uVar6 = uVar20 * 10 + (uint)(byte)len;
            }
            if (0xff < uVar20) goto LAB_0011ee46;
            uVar5 = uVar20;
            if ((((9 < uVar6 - 0x60) && ((ares_bool_t)local_290 != 0)) && (0x19 < uVar6 - 0x91)) &&
               (0x19 < uVar6 - 0x71)) {
              uVar5 = uVar20 & 0xff;
LAB_0011edea:
              uVar6 = uVar5 - 0x2a;
              if ((0x35 < uVar6) ||
                 (uVar5 = uVar20, (0x20000000000039U >> ((ulong)uVar6 & 0x3f) & 1) == 0))
              goto LAB_0011ee46;
            }
          }
          else if (((ares_bool_t)local_290 != 0) &&
                  (uVar20 = uVar5, 0x19 < (byte)(((byte)len & 0xdf) + 0xbf))) goto LAB_0011edea;
          aVar3 = ares_buf_append_byte(local_268,(uchar)uVar5);
joined_r0x0011ee17:
          if (aVar3 != ARES_SUCCESS) goto LAB_0011ee46;
        }
        if (local_291 != 0x2e) {
          if (((((ares_bool_t)local_290 == 0) || ((byte)(local_291 - 0x30) < 10)) ||
              ((byte)((local_291 & 0xdf) + 0xbf) < 0x1a)) ||
             ((local_291 - 0x2a < 0x36 &&
              ((0x20000000000029U >> ((ulong)(local_291 - 0x2a) & 0x3f) & 1) != 0)))) {
            aVar3 = ares_buf_append_byte(local_268,local_291);
            goto joined_r0x0011ee17;
          }
          goto LAB_0011ee46;
        }
        local_268 = ares_dns_labels_add(local_288);
      } while (local_268 != (ares_buf_t *)0x0);
    }
    aVar3 = ARES_ENOMEM;
  }
LAB_0011ee46:
  ares_buf_destroy(paVar10);
  paVar2 = local_288;
  if (aVar3 == ARES_SUCCESS) {
    uVar19 = 0;
    local_290 = uVar8;
    do {
      sVar9 = ares_array_len(paVar2);
      ppaVar17 = local_270;
      if (sVar9 <= uVar19) {
        puVar14 = local_248;
        uVar8 = local_290;
        if ((char)local_274 == '\0') goto LAB_0011efbe;
        bVar21 = local_270 != (ares_llist_t **)0x0;
        aVar3 = ares_buf_append_byte(buf_00,'\0');
        if ((aVar3 == ARES_SUCCESS && bVar21) && (aVar3 = ARES_SUCCESS, local_290 != 0))
        goto LAB_0011f0c3;
        break;
      }
      len = 0;
      paVar10 = ares_dns_labels_get_at(paVar2,uVar19);
      data = ares_buf_peek(paVar10,&len);
      aVar3 = ares_buf_append_byte(buf_00,(byte)len);
      if (aVar3 != ARES_SUCCESS) break;
      aVar3 = ares_buf_append(buf_00,data,len);
      uVar19 = uVar19 + 1;
    } while (aVar3 == ARES_SUCCESS);
  }
LAB_0011f1a8:
  ares_array_destroy(local_288);
  return aVar3;
LAB_0011f07a:
  sVar9 = ares_array_len(paVar2);
  if (sVar9 <= uVar19) goto LAB_0011f158;
  paVar12 = ares_dns_labels_get_at(paVar2,uVar19);
  sVar9 = ares_buf_len(paVar12);
  uVar8 = local_290;
  if (sVar9 - 0x40 < 0xffffffffffffffc1) goto LAB_0011ee46;
  lVar18 = lVar18 + sVar9;
  uVar19 = uVar19 + 1;
  goto LAB_0011f07a;
LAB_0011f158:
  sVar9 = ares_array_len(paVar2);
  uVar8 = local_290;
  if ((sVar9 == 0) ||
     (sVar9 = ares_array_len(local_288), 0xfffffffffffffeff < (sVar9 + lVar18) - 0x101)) {
    aVar3 = ARES_SUCCESS;
  }
  goto LAB_0011ee46;
}

Assistant:

ares_status_t ares_dns_name_write(ares_buf_t *buf, ares_llist_t **list,
                                  ares_bool_t validate_hostname,
                                  const char *name)
{
  const ares_nameoffset_t *off = NULL;
  size_t                   name_len;
  size_t                   orig_name_len;
  size_t                   pos    = ares_buf_len(buf);
  ares_array_t            *labels = NULL;
  char                     name_copy[512];
  ares_status_t            status;

  if (buf == NULL || name == NULL) {
    return ARES_EFORMERR; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  labels = ares_array_create(sizeof(ares_buf_t *), ares_dns_labels_free_cb);
  if (labels == NULL) {
    return ARES_ENOMEM;
  }

  /* NOTE: due to possible escaping, name_copy buffer is > 256 to allow for
   *       this */
  name_len      = ares_strcpy(name_copy, name, sizeof(name_copy));
  orig_name_len = name_len;

  /* Find longest match */
  if (list != NULL) {
    off = ares_nameoffset_find(*list, name_copy);
    if (off != NULL && off->name_len != name_len) {
      /* truncate */
      name_len            -= (off->name_len + 1);
      name_copy[name_len]  = 0;
    }
  }

  /* Output labels */
  if (off == NULL || off->name_len != orig_name_len) {
    size_t i;

    status = ares_split_dns_name(labels, validate_hostname, name_copy);
    if (status != ARES_SUCCESS) {
      goto done;
    }

    for (i = 0; i < ares_array_len(labels); i++) {
      size_t               len  = 0;
      const ares_buf_t    *lbuf = ares_dns_labels_get_at(labels, i);
      const unsigned char *ptr  = ares_buf_peek(lbuf, &len);

      status = ares_buf_append_byte(buf, (unsigned char)(len & 0xFF));
      if (status != ARES_SUCCESS) {
        goto done; /* LCOV_EXCL_LINE: OutOfMemory */
      }

      status = ares_buf_append(buf, ptr, len);
      if (status != ARES_SUCCESS) {
        goto done; /* LCOV_EXCL_LINE: OutOfMemory */
      }
    }

    /* If we are NOT jumping to another label, output terminator */
    if (off == NULL) {
      status = ares_buf_append_byte(buf, 0);
      if (status != ARES_SUCCESS) {
        goto done; /* LCOV_EXCL_LINE: OutOfMemory */
      }
    }
  }

  /* Output name compression offset jump */
  if (off != NULL) {
    unsigned short u16 =
      (unsigned short)0xC000 | (unsigned short)(off->idx & 0x3FFF);
    status = ares_buf_append_be16(buf, u16);
    if (status != ARES_SUCCESS) {
      goto done; /* LCOV_EXCL_LINE: OutOfMemory */
    }
  }

  /* Store pointer for future jumps as long as its not an exact match for
   * a prior entry */
  if (list != NULL && (off == NULL || off->name_len != orig_name_len) &&
      name_len > 0) {
    status = ares_nameoffset_create(list, name /* not truncated copy! */, pos);
    if (status != ARES_SUCCESS) {
      goto done; /* LCOV_EXCL_LINE: OutOfMemory */
    }
  }

  status = ARES_SUCCESS;

done:
  ares_array_destroy(labels);
  return status;
}